

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::genTessLevelCases
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,int numCases)

{
  float local_34;
  int local_30;
  int local_2c;
  int j;
  int i;
  Random rnd;
  int numCases_local;
  vector<float,_std::allocator<float>_> *result;
  
  rnd.m_rnd.z = numCases;
  unique0x100000a5 = __return_storage_ptr__;
  de::Random::Random((Random *)&i,0x7b);
  j._3_1_ = 0;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  for (local_2c = 0; local_2c < (int)rnd.m_rnd.z; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
      local_34 = de::Random::getFloat((Random *)&i,1.0,63.0);
      std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_34);
    }
  }
  j._3_1_ = 1;
  de::Random::~Random((Random *)&i);
  return __return_storage_ptr__;
}

Assistant:

vector<float> TessCoordComponentInvarianceCase::genTessLevelCases (int numCases)
{
	de::Random		rnd(123);
	vector<float>	result;

	for (int i = 0; i < numCases; i++)
		for (int j = 0; j < 6; j++)
			result.push_back(rnd.getFloat(1.0f, 63.0f));

	return result;
}